

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh_asn1.cc
# Opt level: O2

dh_st * EVP_PKEY_get1_DH(EVP_PKEY *pkey)

{
  DH *dh;
  
  dh = (DH *)EVP_PKEY_get0_DH((EVP_PKEY *)pkey);
  if (dh != (DH *)0x0) {
    DH_up_ref(dh);
  }
  return dh;
}

Assistant:

DH *EVP_PKEY_get1_DH(const EVP_PKEY *pkey) {
  DH *dh = EVP_PKEY_get0_DH(pkey);
  if (dh != NULL) {
    DH_up_ref(dh);
  }
  return dh;
}